

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Rect.h
# Opt level: O1

bool __thiscall DisjointRectCollection::Disjoint(DisjointRectCollection *this,Rect *r)

{
  bool bVar1;
  long lVar2;
  ulong uVar3;
  bool bVar4;
  
  bVar4 = true;
  if ((((r->width != 0) && (r->height != 0)) && (bVar4 = (this->rects).Count == 0, !bVar4)) &&
     (bVar1 = Disjoint((this->rects).Array,r), bVar1)) {
    uVar3 = 0;
    lVar2 = 0x10;
    do {
      uVar3 = uVar3 + 1;
      bVar4 = (this->rects).Count <= uVar3;
      if (bVar4) {
        return bVar4;
      }
      bVar1 = Disjoint((Rect *)((long)&((this->rects).Array)->x + lVar2),r);
      lVar2 = lVar2 + 0x10;
    } while (bVar1);
  }
  return bVar4;
}

Assistant:

bool Disjoint(const Rect &r) const
	{
		// Degenerate rectangles are ignored.
		if (r.width == 0 || r.height == 0)
			return true;

		for(unsigned i = 0; i < rects.Size(); ++i)
			if (!Disjoint(rects[i], r))
				return false;
		return true;
	}